

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,uint value)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)value;
  if (cctx->streamStage != zcss_init) {
    if (((7 < param - ZSTD_p_compressionLevel) || (param - ZSTD_p_compressionLevel == 1)) &&
       (param != ZSTD_p_compressLiterals)) {
      return 0xffffffffffffffc4;
    }
    cctx->cParamsChanged = 1;
  }
  if ((param - ZSTD_p_windowLog < 7) || (param - ZSTD_p_enableLongDistanceMatching < 5)) {
    if (cctx->cdict != (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc4;
    }
LAB_00144d11:
    sVar1 = ZSTD_CCtxParam_setParameter(&cctx->requestedParams,param,value);
    return sVar1;
  }
  if ((param - ZSTD_p_contentSizeFlag < 3) || (param - ZSTD_p_jobSize < 2)) goto LAB_00144d11;
  if (param == ZSTD_p_forceMaxWindow) {
    (cctx->requestedParams).forceWindow = (uint)(value != 0);
    return (ulong)(value != 0);
  }
  if (param != ZSTD_p_compressionLevel) {
    if (param == ZSTD_p_nbWorkers) {
      sVar1 = 0xffffffffffffffd8;
      if (value == 0) {
        sVar1 = 0;
      }
      return sVar1;
    }
    if (param != ZSTD_p_compressLiterals) {
      if ((param == ZSTD_p_format) && (value < 2)) {
        (cctx->requestedParams).format = value;
        return (ulong)value;
      }
      return 0xffffffffffffffd8;
    }
    goto LAB_00144d11;
  }
  if (cctx->cdict != (ZSTD_CDict *)0x0) {
    return 0xffffffffffffffc4;
  }
  if ((int)value < 0x17) {
    if (value == 0) {
      uVar2 = (cctx->requestedParams).compressionLevel;
      goto LAB_00144d5e;
    }
  }
  else {
    uVar3 = 0x16;
  }
  uVar2 = (uint)uVar3;
  (cctx->requestedParams).disableLiteralCompression = (int)(uVar3 >> 0x1f);
  (cctx->requestedParams).compressionLevel = uVar2;
LAB_00144d5e:
  sVar1 = 0;
  if (0 < (int)uVar2) {
    sVar1 = (size_t)uVar2;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, unsigned value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%u, %u)", (U32)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            return ERROR(stage_wrong);
    }   }

    switch(param)
    {
    case ZSTD_p_format :
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_compressionLevel:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_windowLog:
    case ZSTD_p_hashLog:
    case ZSTD_p_chainLog:
    case ZSTD_p_searchLog:
    case ZSTD_p_minMatch:
    case ZSTD_p_targetLength:
    case ZSTD_p_compressionStrategy:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_compressLiterals:
    case ZSTD_p_contentSizeFlag:
    case ZSTD_p_checksumFlag:
    case ZSTD_p_dictIDFlag:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_forceMaxWindow :  /* Force back-references to remain < windowSize,
                                   * even when referencing into Dictionary content.
                                   * default : 0 when using a CDict, 1 when using a Prefix */
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_nbWorkers:
        if ((value>0) && cctx->staticSize) {
            return ERROR(parameter_unsupported);  /* MT not compatible with static alloc */
        }
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_jobSize:
    case ZSTD_p_overlapSizeLog:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_enableLongDistanceMatching:
    case ZSTD_p_ldmHashLog:
    case ZSTD_p_ldmMinMatch:
    case ZSTD_p_ldmBucketSizeLog:
    case ZSTD_p_ldmHashEveryLog:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    default: return ERROR(parameter_unsupported);
    }
}